

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O3

QStringList *
QStandardPaths::standardLocations(QStringList *__return_storage_ptr__,StandardLocation type)

{
  Data *pDVar1;
  QString *pQVar2;
  qsizetype qVar3;
  pointer pQVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QArrayData *local_98;
  QStringBuilder<QString,_QLatin1String> local_78;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(type) {
  case FontsLocation:
    QDir::homePath();
    local_78.a.d.d = (Data *)local_98;
    local_78.b.m_size = 7;
    local_78.b.m_data = "/.fonts";
    QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&local_48,&local_78);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (QString *)&local_48);
    QList<QString>::end(__return_storage_ptr__);
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    xdgDataDirs();
    QList<QString>::operator+=(__return_storage_ptr__,(QList<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    if (1 < (ulong)(__return_storage_ptr__->d).size) {
      uVar5 = 1;
      lVar6 = 0x18;
      do {
        pQVar4 = QList<QString>::data(__return_storage_ptr__);
        str_00.m_data = "/fonts";
        str_00.m_size = 6;
        QString::append((QString *)((long)&(pQVar4->d).d + lVar6),str_00);
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < (ulong)(__return_storage_ptr__->d).size);
    }
    break;
  case ApplicationsLocation:
    xdgDataDirs();
    qVar3 = local_48.size;
    pQVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_78.a.d.d = (Data *)(__return_storage_ptr__->d).d;
    local_78.a.d.ptr = (char16_t *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pQVar2;
    local_78.a.d.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if ((__return_storage_ptr__->d).size != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pQVar4 = QList<QString>::data(__return_storage_ptr__);
        str.m_data = "/applications";
        str.m_size = 0xd;
        QString::append((QString *)((long)&(pQVar4->d).d + lVar6),str);
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < (ulong)(__return_storage_ptr__->d).size);
    }
    break;
  case AppLocalDataLocation:
  case AppDataLocation:
    xdgDataDirs();
    qVar3 = local_48.size;
    pQVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_78.a.d.d = (Data *)(__return_storage_ptr__->d).d;
    local_78.a.d.ptr = (char16_t *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pQVar2;
    local_78.a.d.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if ((__return_storage_ptr__->d).size != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pQVar4 = QList<QString>::data(__return_storage_ptr__);
        appendOrganizationAndApp((QString *)((long)&(pQVar4->d).d + lVar6));
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < (ulong)(__return_storage_ptr__->d).size);
    }
    break;
  case GenericDataLocation:
    xdgDataDirs();
    goto LAB_0043d929;
  case ConfigLocation:
  case GenericConfigLocation:
    xdgConfigDirs();
LAB_0043d929:
    qVar3 = local_48.size;
    pQVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_78.a.d.d = (Data *)(__return_storage_ptr__->d).d;
    local_78.a.d.ptr = (char16_t *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pQVar2;
    local_78.a.d.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    break;
  case AppConfigLocation:
    xdgConfigDirs();
    qVar3 = local_48.size;
    pQVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_78.a.d.d = (Data *)(__return_storage_ptr__->d).d;
    local_78.a.d.ptr = (char16_t *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = pQVar2;
    local_78.a.d.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    if ((__return_storage_ptr__->d).size != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pQVar4 = QList<QString>::data(__return_storage_ptr__);
        appendOrganizationAndApp((QString *)((long)&(pQVar4->d).d + lVar6));
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < (ulong)(__return_storage_ptr__->d).size);
    }
  }
  local_78.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  writableLocation(&local_78.a,type);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)__return_storage_ptr__,0,&local_78.a);
  if (&(local_78.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QStandardPaths::standardLocations(StandardLocation type)
{
    QStringList dirs;
    switch (type) {
    case ConfigLocation:
    case GenericConfigLocation:
        dirs = xdgConfigDirs();
        break;
    case AppConfigLocation:
        dirs = xdgConfigDirs();
        for (int i = 0; i < dirs.size(); ++i)
            appendOrganizationAndApp(dirs[i]);
        break;
    case GenericDataLocation:
        dirs = xdgDataDirs();
        break;
    case ApplicationsLocation:
        dirs = xdgDataDirs();
        for (int i = 0; i < dirs.size(); ++i)
            dirs[i].append("/applications"_L1);
        break;
    case AppDataLocation:
    case AppLocalDataLocation:
        dirs = xdgDataDirs();
        for (int i = 0; i < dirs.size(); ++i)
            appendOrganizationAndApp(dirs[i]);
        break;
    case FontsLocation:
        dirs += QDir::homePath() + "/.fonts"_L1;
        dirs += xdgDataDirs();
        for (int i = 1; i < dirs.size(); ++i)
            dirs[i].append("/fonts"_L1);
        break;
    default:
        break;
    }
    const QString localDir = writableLocation(type);
    dirs.prepend(localDir);
    return dirs;
}